

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda.h
# Opt level: O0

void __thiscall xemmai::t_lambda::t_lambda(t_lambda *this,t_object *a_scope,t_object *a_code)

{
  t_object *this_00;
  t_code *ptVar1;
  reference ppvVar2;
  t_code *code;
  t_object *a_code_local;
  t_object *a_scope_local;
  t_lambda *this_local;
  
  t_slot::t_slot(&this->v_scope,a_scope);
  t_slot::t_slot(&this->v_code,a_code);
  this_00 = t_slot::operator->(&this->v_code);
  ptVar1 = t_object::f_as<xemmai::t_code>(this_00);
  this->v_size = ptVar1->v_size;
  this->v_arguments = ptVar1->v_arguments;
  this->v_privates = ptVar1->v_privates;
  ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&ptVar1->v_instructions,0);
  this->v_instructions = ppvVar2;
  return;
}

Assistant:

t_lambda(t_object* a_scope, t_object* a_code) : v_scope(a_scope), v_code(a_code)
	{
		auto& code = v_code->f_as<t_code>();
		v_size = code.v_size;
		v_arguments = code.v_arguments;
		v_privates = code.v_privates;
		v_instructions = &code.v_instructions[0];
	}